

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O3

void brotli::HistogramReindex<brotli::Histogram<704>>
               (vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *out,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *symbols)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  mapped_type_conflict *pmVar5;
  pointer puVar6;
  pointer puVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  size_type __new_size;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> tmp;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  new_index;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> local_78;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::vector
            (&local_78,out);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  __new_size = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar6 = (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (puVar7 != puVar6) {
    uVar8 = 0;
    do {
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001739b9:
        pmVar5 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)&local_60,puVar6 + uVar8);
        *pmVar5 = (mapped_type_conflict)__new_size;
        memcpy((out->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start + __new_size,
               local_78.
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
               _M_impl.super__Vector_impl_data._M_start +
               (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar8],0xb10);
        __new_size = (size_type)((mapped_type_conflict)__new_size + 1);
        puVar6 = (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar7 = (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        _Var2 = puVar6[uVar8];
        p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &p_Var1->_M_header;
        do {
          p_Var10 = p_Var11;
          p_Var9 = p_Var4;
          _Var3 = p_Var9[1]._M_color;
          p_Var11 = p_Var9;
          if (_Var3 < _Var2) {
            p_Var11 = p_Var10;
          }
          p_Var4 = (&p_Var9->_M_left)[_Var3 < _Var2];
        } while ((&p_Var9->_M_left)[_Var3 < _Var2] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var11 == p_Var1) goto LAB_001739b9;
        if (_Var3 < _Var2) {
          p_Var9 = p_Var10;
        }
        if (_Var2 < p_Var9[1]._M_color) goto LAB_001739b9;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)puVar7 - (long)puVar6 >> 2));
  }
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize
            (out,__new_size);
  puVar6 = (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar6) {
    uVar8 = 0;
    do {
      pmVar5 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_60,puVar6 + uVar8);
      puVar6 = (symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar6[uVar8] = *pmVar5;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)(symbols->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2));
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_60);
  if (local_78.super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HistogramReindex(std::vector<HistogramType>* out,
                      std::vector<uint32_t>* symbols) {
  std::vector<HistogramType> tmp(*out);
  std::map<uint32_t, uint32_t> new_index;
  uint32_t next_index = 0;
  for (size_t i = 0; i < symbols->size(); ++i) {
    if (new_index.find((*symbols)[i]) == new_index.end()) {
      new_index[(*symbols)[i]] = next_index;
      (*out)[next_index] = tmp[(*symbols)[i]];
      ++next_index;
    }
  }
  out->resize(next_index);
  for (size_t i = 0; i < symbols->size(); ++i) {
    (*symbols)[i] = new_index[(*symbols)[i]];
  }
}